

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::checkAndLogProgram
               (ShaderProgram *program,Program *programDefinition,Functions *gl,TestLog *log)

{
  ostringstream *this;
  TestError *this_00;
  ScopedLogSection section;
  ScopedLogSection local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Program","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,(string *)local_1b0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  glu::operator<<(log,program);
  if ((program->m_program).m_info.linkOk != false) {
    tcu::TestLog::endSection(local_1d8.m_log);
    return;
  }
  this = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,
             "Program build failed, checking if program exceeded implementation limits",0x48);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  checkProgramResourceUsage(programDefinition,gl,log);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"could not build program","");
  tcu::TestError::TestError(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkAndLogProgram (const glu::ShaderProgram& program, const ProgramInterfaceDefinition::Program* programDefinition, const glw::Functions& gl, tcu::TestLog& log)
{
	const tcu::ScopedLogSection section(log, "Program", "Program");

	log << program;
	if (!program.isOk())
	{
		log << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
		checkProgramResourceUsage(programDefinition, gl, log);

		// within limits
		throw tcu::TestError("could not build program");
	}
}